

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O3

bool __thiscall Js::RecyclableObject::IsWritableDataOnlyDetectionBitSet(RecyclableObject *this)

{
  bool bVar1;
  byte bVar2;
  DynamicObject *this_00;
  DynamicTypeHandler *this_01;
  
  bVar1 = DynamicType::Is(((this->type).ptr)->typeId);
  if (bVar1) {
    do {
      this_00 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(this);
      this_01 = DynamicObject::GetTypeHandler(this_00);
      bVar2 = DynamicTypeHandler::GetPropertyTypes(this_01);
      bVar1 = (bool)(bVar2 >> 5 & 1);
      if (bVar1 != false) {
        return bVar1;
      }
      bVar1 = DynamicObject::HasObjectArray(this_00);
      if (!bVar1) {
        return false;
      }
      this = *(RecyclableObject **)&this_00->field_1;
      bVar1 = DynamicType::Is(**(TypeId **)((long)this + 8));
    } while (bVar1);
  }
  return false;
}

Assistant:

bool RecyclableObject::IsWritableDataOnlyDetectionBitSet()
    {
        if (DynamicType::Is(this->GetTypeId()))
        {
            DynamicObject* obj = UnsafeVarTo<DynamicObject>(this);
            return obj->GetTypeHandler()->IsWritableDataOnlyDetectionBitSet() ||
                (obj->HasObjectArray() && obj->GetObjectArrayOrFlagsAsArray()->IsWritableDataOnlyDetectionBitSet());
        }

        return false;
    }